

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3OpenMethod(sqlite3_vtab *pVTab,sqlite3_vtab_cursor **ppCsr)

{
  sqlite3_vtab_cursor *__s;
  sqlite3_vtab_cursor *pCsr;
  sqlite3_vtab_cursor **ppCsr_local;
  sqlite3_vtab *pVTab_local;
  
  __s = (sqlite3_vtab_cursor *)sqlite3_malloc(0x80);
  *ppCsr = __s;
  if (__s == (sqlite3_vtab_cursor *)0x0) {
    pVTab_local._4_4_ = 7;
  }
  else {
    memset(__s,0,0x80);
    pVTab_local._4_4_ = 0;
  }
  return pVTab_local._4_4_;
}

Assistant:

static int fts3OpenMethod(sqlite3_vtab *pVTab, sqlite3_vtab_cursor **ppCsr){
  sqlite3_vtab_cursor *pCsr;               /* Allocated cursor */

  UNUSED_PARAMETER(pVTab);

  /* Allocate a buffer large enough for an Fts3Cursor structure. If the
  ** allocation succeeds, zero it and return SQLITE_OK. Otherwise, 
  ** if the allocation fails, return SQLITE_NOMEM.
  */
  *ppCsr = pCsr = (sqlite3_vtab_cursor *)sqlite3_malloc(sizeof(Fts3Cursor));
  if( !pCsr ){
    return SQLITE_NOMEM;
  }
  memset(pCsr, 0, sizeof(Fts3Cursor));
  return SQLITE_OK;
}